

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
polyscope::render::backend_openGL3_glfw::GLFrameBuffer::readBuffer(GLFrameBuffer *this)

{
  PFNGLREADPIXELSPROC p_Var1;
  uint uVar2;
  uint uVar3;
  reference pvVar4;
  FrameBuffer *in_RSI;
  allocator_type *in_RDI;
  size_t buffSize;
  int h;
  int w;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buff;
  allocator_type *this_00;
  
  this_00 = in_RDI;
  (*glad_glFlush)();
  (*glad_glFinish)();
  (*in_RSI->_vptr_FrameBuffer[2])();
  uVar2 = FrameBuffer::getSizeX(in_RSI);
  uVar3 = FrameBuffer::getSizeY(in_RSI);
  geometrycentral::surface::std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)0x3dddca);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,(size_type)in_RSI,
             in_RDI);
  geometrycentral::surface::std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)0x3dddea);
  p_Var1 = glad_glReadPixels;
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(uVar3,uVar2)
                     );
  (*p_Var1)(0,0,uVar2,uVar3,0x1908,0x1401,pvVar4);
  return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI;
}

Assistant:

std::vector<unsigned char> GLFrameBuffer::readBuffer() {

  glFlush();
  glFinish();

  bind();

  int w = getSizeX();
  int h = getSizeY();

  // Read from openGL
  size_t buffSize = w * h * 4;
  std::vector<unsigned char> buff(buffSize);
  glReadPixels(0, 0, w, h, GL_RGBA, GL_UNSIGNED_BYTE, &(buff.front()));

  return buff;
}